

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truncated_normal_dist.hpp
# Opt level: O2

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  undefined4 uVar1;
  undefined1 mu [16];
  undefined1 sigma [16];
  undefined1 a [16];
  undefined1 b [16];
  basic_istream<char,_std::char_traits<char>_> *pbVar2;
  istream *piVar3;
  long lVar4;
  param_type *ppVar5;
  byte bVar6;
  undefined6 in_stack_fffffffffffffef2;
  undefined6 in_stack_ffffffffffffff02;
  undefined6 in_stack_ffffffffffffff12;
  undefined6 in_stack_ffffffffffffff22;
  delim_c local_cc;
  delim_c local_cb;
  delim_c local_ca;
  delim_c local_c9;
  unkbyte10 local_c8;
  unkbyte10 local_b8;
  unkbyte10 local_a8;
  unkbyte10 local_98;
  param_type local_88;
  
  bVar6 = 0;
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_88.mu_._0_1_ = 0x28;
  pbVar2 = utility::operator>>(in,(delim_c *)&local_88);
  piVar3 = std::istream::_M_extract<long_double>((longdouble *)pbVar2);
  local_c9.c = ' ';
  pbVar2 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_c9);
  piVar3 = std::istream::_M_extract<long_double>((longdouble *)pbVar2);
  local_ca.c = ' ';
  pbVar2 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_ca);
  piVar3 = std::istream::_M_extract<long_double>((longdouble *)pbVar2);
  local_cb.c = ' ';
  pbVar2 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_cb);
  piVar3 = std::istream::_M_extract<long_double>((longdouble *)pbVar2);
  local_cc.c = ')';
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_cc);
  lVar4 = *(long *)(*(long *)in + -0x18);
  if (((byte)in[lVar4 + 0x20] & 5) == 0) {
    mu._10_6_ = in_stack_fffffffffffffef2;
    mu._0_10_ = local_98;
    sigma._10_6_ = in_stack_ffffffffffffff02;
    sigma._0_10_ = local_a8;
    a._10_6_ = in_stack_ffffffffffffff12;
    a._0_10_ = local_b8;
    b._10_6_ = in_stack_ffffffffffffff22;
    b._0_10_ = local_c8;
    truncated_normal_dist<long_double>::param_type::param_type
              (&local_88,(result_type_conflict3)mu,(result_type_conflict3)sigma,
               (result_type_conflict3)a,(result_type_conflict3)b);
    ppVar5 = &local_88;
    for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
      *(undefined8 *)&P->mu_ = *(undefined8 *)&ppVar5->mu_;
      ppVar5 = (param_type *)((long)ppVar5 + (ulong)bVar6 * -0x10 + 8);
      P = (param_type *)((long)P + (ulong)bVar6 * -0x10 + 8);
    }
    lVar4 = *(long *)(*(long *)in + -0x18);
  }
  *(undefined4 *)(in + lVar4 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, param_type &P) {
        float_t mu, sigma, a, b;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> mu >> utility::delim(' ') >> sigma >>
            utility::delim(' ') >> a >> utility::delim(' ') >> b >> utility::delim(')');
        if (in)
          P = param_type(mu, sigma, a, b);
        in.flags(flags);
        return in;
      }